

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trap.c
# Opt level: O3

boolean drown(void)

{
  bool bVar1;
  boolean bVar2;
  char cVar3;
  uint uVar4;
  int iVar5;
  ulong in_RAX;
  undefined8 uVar6;
  char *pcVar7;
  char *pcVar8;
  int tmp;
  int iVar9;
  int y;
  boolean lost;
  undefined8 uStack_38;
  
  bVar1 = true;
  uStack_38 = in_RAX;
  if (((u._1052_1_ & 2) != 0) && (bVar2 = is_pool(level,(int)u.ux0,(int)u.uy0), bVar2 != '\0')) {
    if ((u.uprops[0x39].extrinsic == 0 && u.uprops[0x39].intrinsic == 0) &&
       (((youmonst.data)->mflags1 & 2) == 0)) {
      if (u.usteed == (monst *)0x0) {
        if (u.uprops[0x31].intrinsic == 0) goto LAB_0026ad54;
      }
      else if (((u.usteed)->data->mflags1 & 2) == 0 && u.uprops[0x31].intrinsic == 0) {
LAB_0026ad54:
        if (((youmonst.data)->mflags1 & 0x600) == 0 && u.uprops[0x31].extrinsic == 0)
        goto LAB_0026ad79;
      }
    }
    uVar4 = mt_random();
    bVar1 = false;
    if (0x33333333 < uVar4 * -0x33333333) {
      return '\0';
    }
  }
LAB_0026ad79:
  if ((u._1052_1_ & 2) == 0) {
    bVar2 = on_level(&u.uz,&dungeon_topology.d_water_level);
    pcVar8 = "plunge";
    if (bVar2 == '\0') {
      pcVar8 = "fall";
    }
    uVar6 = 0x2e;
    if ((((u.uprops[0x31].extrinsic == 0 && u.uprops[0x31].intrinsic == 0) &&
         (((youmonst.data)->mflags1 & 0x600) == 0)) && (((youmonst.data)->mflags1 & 2) == 0)) &&
       ((u.uprops[0x39].intrinsic == 0 && (u.uprops[0x39].extrinsic == 0)))) {
      if (u.usteed == (monst *)0x0) {
        uVar6 = 0x21;
      }
      else {
        uVar6 = 0x2e;
        if (((u.usteed)->data->mflags1 & 2) == 0) {
          uVar6 = 0x21;
        }
      }
    }
    pline("You %s into the water%c",pcVar8,uVar6);
    if ((((u.uprops[0x39].extrinsic == 0 && u.uprops[0x39].intrinsic == 0) &&
         (((youmonst.data)->mflags1 & 2) == 0)) &&
        ((u.usteed == (monst *)0x0 || (((u.usteed)->data->mflags1 & 2) == 0)))) &&
       (bVar2 = on_level(&u.uz,&dungeon_topology.d_water_level), bVar2 == '\0')) {
      if (((u.uprops[0x23].intrinsic != 0) && (u.uprops[0x24].extrinsic == 0)) &&
         (u.umonnum != u.umonster)) {
        dmgtype(youmonst.data,0x24);
      }
      pline("You sink like %s.");
    }
  }
  water_damage(invent,'\0','\0');
  if ((u.umonnum == 0x29) && (uVar4 = mt_random(), 0x55555555 < uVar4 * -0x55555555)) {
    split_mon(&youmonst,(monst *)0x0);
  }
  else if (u.umonnum == 0x10a) {
    pline("You rust!");
    iVar5 = 2;
    iVar9 = -2;
    do {
      uVar4 = mt_random();
      iVar5 = iVar5 + uVar4 % 6;
      iVar9 = iVar9 + 1;
    } while (iVar9 != 0);
    if (u.mhmax - iVar5 != 0 && iVar5 <= u.mhmax) {
      u.mhmax = u.mhmax - iVar5;
    }
    losehp(iVar5,"rusting away",1);
  }
  if (!bVar1) {
    return '\0';
  }
  iVar5 = number_leashed();
  if (0 < iVar5) {
    pcVar8 = "es";
    if (iVar5 == 1) {
      pcVar8 = "";
    }
    pcVar7 = "s";
    if (iVar5 != 1) {
      pcVar7 = "";
    }
    pline("The leash%s slip%s loose.",pcVar8,pcVar7);
    unleash_all();
  }
  if (u.uprops[0x31].extrinsic == 0 && u.uprops[0x31].intrinsic == 0) {
    uVar4 = (youmonst.data)->mflags1;
    if (((((uVar4 & 2) == 0) && ((uVar4 & 0x600) == 0)) &&
        ((u.uprops[0x39].intrinsic == 0 && (u.uprops[0x39].extrinsic == 0)))) &&
       ((u.usteed == (monst *)0x0 || (((u.usteed)->data->mflags1 & 2) == 0)))) {
      if (((u.uprops[0xe].extrinsic != 0 || u.uprops[0xe].intrinsic != 0) ||
          ((uVar4 >> 0x19 & 1) != 0)) &&
         ((u.usleep == 0 &&
          ((((uVar4 & 0x4000000) != 0 || u.uprops[0xf].extrinsic != 0) ||
            u.uprops[0xf].intrinsic != 0 ||
           (uVar4 = mt_random(), (int)(uVar4 % 3) < (int)u.uluck + (int)u.moreluck + 2)))))) {
        pline("You attempt a teleport spell.");
        if (((level->flags).field_0x9 & 8) == 0) {
          dotele();
          bVar2 = is_pool(level,(int)u.ux,(int)u.uy);
          if (bVar2 == '\0') {
            return '\x01';
          }
        }
        else {
          pline("The attempted teleport spell fails.");
        }
      }
      if (u.usteed != (monst *)0x0) {
        dismount_steed(0);
        bVar2 = is_pool(level,(int)u.ux,(int)u.uy);
        if (bVar2 == '\0') {
          return '\x01';
        }
      }
      if (u.usleep != 0) {
        unmul("Suddenly you wake up!");
      }
      if ((-1 < multi) && ((u.umonnum == u.umonster || ((youmonst.data)->mmove != '\0')))) {
        iVar5 = 100;
        do {
          uVar4 = mt_random();
          iVar9 = (int)u.ux + uVar4 % 3 + -1;
          uVar4 = mt_random();
          y = (int)u.uy + uVar4 % 3 + -1;
          bVar2 = goodpos(level,iVar9,y,&youmonst,0);
          if (bVar2 != '\0') goto LAB_0026b32b;
          iVar5 = iVar5 + -1;
        } while (iVar5 != 0);
        uVar4 = (uint)(byte)u.uy;
        iVar9 = u.ux + -1;
        do {
          y = (char)uVar4 + -1;
          do {
            bVar2 = goodpos(level,iVar9,y,&youmonst,0);
            if (bVar2 != '\0') goto LAB_0026b32b;
            uVar4 = (uint)u.uy;
            bVar1 = y <= (int)uVar4;
            y = y + 1;
          } while (bVar1);
          bVar1 = iVar9 <= u.ux;
          iVar9 = iVar9 + 1;
        } while (bVar1);
      }
LAB_0026b3bf:
      u._1052_1_ = u._1052_1_ | 2;
      if ((((u.umonnum != u.umonster) && (u.uprops[0x3d].intrinsic == 0)) &&
          (u.uprops[0x3d].extrinsic == 0)) && (urace.malenum == 0xe8)) {
        rehumanize();
        u._1052_1_ = u._1052_1_ & 0xfd;
        return '\x01';
      }
      pline("You drown.");
      killer_format = 0;
      if (level->locations[u.ux][u.uy].typ == '\x11') {
        killer = "pool of water";
      }
      else {
        bVar2 = on_level(&u.uz,&dungeon_topology.d_medusa_level);
        killer = "pool of water";
        if (bVar2 == '\0') {
          killer = "moat";
        }
      }
      done(4);
      cVar3 = safe_teleds('\x01');
      while (cVar3 == '\0') {
        pline("You\'re still drowning.");
        done(4);
        cVar3 = safe_teleds('\x01');
      }
      if ((u._1052_1_ & 2) != 0) {
        u._1052_1_ = u._1052_1_ & 0xfd;
        bVar2 = on_level(&u.uz,&dungeon_topology.d_water_level);
        pcVar8 = "in an air bubble";
        if (bVar2 == '\0') {
          pcVar8 = "on land";
        }
        pline("You find yourself back %s.",pcVar8);
        return '\x01';
      }
      return '\x01';
    }
    if ((uVar4 & 0x600) == 0) goto LAB_0026b199;
  }
  if (flags.verbose != '\0') {
    pline("But you aren\'t drowning.");
  }
  bVar2 = on_level(&u.uz,&dungeon_topology.d_water_level);
  if (bVar2 == '\0') {
    if (((u.uprops[0x23].intrinsic == 0) || (u.uprops[0x24].extrinsic != 0)) ||
       ((pcVar8 = "Your keel hits the bottom.", u.umonnum != u.umonster &&
        (bVar2 = dmgtype(youmonst.data,0x24), bVar2 != '\0')))) {
      pcVar8 = "You touch bottom.";
    }
    pline(pcVar8);
  }
LAB_0026b199:
  if (uball != (obj *)0x0) {
    unplacebc();
    placebc();
  }
  vision_recalc(2);
  u._1052_1_ = u._1052_1_ | 2;
  under_water(1);
  vision_full_recalc = '\x01';
  return '\0';
LAB_0026b32b:
  uStack_38 = uStack_38 & 0xffffffffffffff;
  bVar2 = on_level(&u.uz,&dungeon_topology.d_water_level);
  if (bVar2 != '\0') {
    pline("You try to crawl out of the water.");
LAB_0026b391:
    pline("Pheew!  That was close.");
    teleds(iVar9,y,'\x01');
    return '\x01';
  }
  bVar2 = emergency_disrobe((boolean *)((long)&uStack_38 + 7));
  cVar3 = uStack_38._7_1_;
  pline("You try to crawl out of the water.");
  if (cVar3 != '\0') {
    pline("You dump some of your gear to lose weight...");
  }
  if (bVar2 != '\0') goto LAB_0026b391;
  pline("But in vain.");
  goto LAB_0026b3bf;
}

Assistant:

boolean drown(void)
{
	boolean inpool_ok = FALSE, crawl_ok;
	int i, x, y;

	/* happily wading in the same contiguous pool */
	if (u.uinwater && is_pool(level, u.ux0, u.uy0) &&
	    (Swimming || Amphibious)) {
		/* water effects on objects every now and then */
		if (!rn2(5)) inpool_ok = TRUE;
		else return FALSE;
	}

	if (!u.uinwater) {
	    pline("You %s into the water%c",
		Is_waterlevel(&u.uz) ? "plunge" : "fall",
		Amphibious || Swimming ? '.' : '!');
	    if (!Swimming && !Is_waterlevel(&u.uz))
		    pline("You sink like %s.",
			Hallucination ? "the Titanic" : "a rock");
	}

	water_damage(invent, FALSE, FALSE);

	if (u.umonnum == PM_GREMLIN && rn2(3))
	    split_mon(&youmonst, NULL);
	else if (u.umonnum == PM_IRON_GOLEM) {
	    pline("You rust!");
	    i = dice(2,6);
	    if (u.mhmax > i) u.mhmax -= i;
	    losehp(i, "rusting away", KILLED_BY);
	}
	if (inpool_ok) return FALSE;

	if ((i = number_leashed()) > 0) {
		pline("The leash%s slip%s loose.",
			(i > 1) ? "es" : "",
			(i > 1) ? "" : "s");
		unleash_all();
	}

	if (Amphibious || Swimming) {
		if (Amphibious) {
			if (flags.verbose)
				pline("But you aren't drowning.");
			if (!Is_waterlevel(&u.uz)) {
				if (Hallucination)
					pline("Your keel hits the bottom.");
				else
					pline("You touch bottom.");
			}
		}
		if (Punished) {
			unplacebc();
			placebc();
		}
		vision_recalc(2);	/* unsee old position */
		u.uinwater = 1;
		under_water(1);
		vision_full_recalc = 1;
		return FALSE;
	}
	if ((Teleportation || can_teleport(youmonst.data)) &&
		    !u.usleep && (Teleport_control || rn2(3) < Luck+2)) {
		pline("You attempt a teleport spell.");	/* utcsri!carroll */
		if (!level->flags.noteleport) {
			dotele();
			if (!is_pool(level, u.ux,u.uy))
				return TRUE;
		} else pline("The attempted teleport spell fails.");
	}
	if (u.usteed) {
		dismount_steed(DISMOUNT_GENERIC);
		if (!is_pool(level, u.ux,u.uy))
			return TRUE;
	}
	crawl_ok = FALSE;
	x = y = 0;		/* lint suppression */
	/* if sleeping, wake up now so that we don't crawl out of water
	   while still asleep; we can't do that the same way that waking
	   due to combat is handled; note unmul() clears u.usleep */
	if (u.usleep) unmul("Suddenly you wake up!");
	/* can't crawl if unable to move (crawl_ok flag stays false) */
	if (multi < 0 || (Upolyd && !youmonst.data->mmove)) goto crawl;
	/* look around for a place to crawl to */
	for (i = 0; i < 100; i++) {
		x = rn1(3,u.ux - 1);
		y = rn1(3,u.uy - 1);
		if (goodpos(level, x, y, &youmonst, 0)) {
			crawl_ok = TRUE;
			goto crawl;
		}
	}
	/* one more scan */
	for (x = u.ux - 1; x <= u.ux + 1; x++)
		for (y = u.uy - 1; y <= u.uy + 1; y++)
			if (goodpos(level, x, y, &youmonst, 0)) {
				crawl_ok = TRUE;
				goto crawl;
			}
 crawl:
	if (crawl_ok) {
		boolean lost = FALSE;
		/* time to do some strip-tease... */
		boolean succ = Is_waterlevel(&u.uz) ? TRUE :
				emergency_disrobe(&lost);

		pline("You try to crawl out of the water.");
		if (lost)
			pline("You dump some of your gear to lose weight...");
		if (succ) {
			pline("Pheew!  That was close.");
			teleds(x,y,TRUE);
			return TRUE;
		}
		/* still too much weight */
		pline("But in vain.");
	}
	u.uinwater = 1;
	/* [ALI] Vampires return to vampiric form on drowning. */
	if (Upolyd && !Unchanging && Race_if(PM_VAMPIRE)) {
		rehumanize();
		u.uinwater = 0;
		/* should be unnecessary as spoteffects() should get called */
		/* pline("You fly up out of the water!"); */
		return TRUE;
	}
	pline("You drown.");
	killer_format = KILLED_BY_AN;
	killer = (level->locations[u.ux][u.uy].typ == POOL || Is_medusa_level(&u.uz)) ?
	    "pool of water" : "moat";
	done(DROWNING);
	/* oops, we're still alive.  better get out of the water. */
	while (!safe_teleds(TRUE)) {
		pline("You're still drowning.");
		done(DROWNING);
	}
	if (u.uinwater) {
		u.uinwater = 0;
		pline("You find yourself back %s.",
		      Is_waterlevel(&u.uz) ? "in an air bubble" : "on land");
	}
	return TRUE;
}